

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-color.c
# Opt level: O3

int color_char_to_attr(char c)

{
  color_type *pcVar1;
  long lVar2;
  
  if (c < '\0') {
    return (int)c;
  }
  if ((c & 0x5fU) != 0) {
    pcVar1 = color_table;
    lVar2 = 0;
    do {
      if (pcVar1->index_char == c) {
        if (lVar2 == -0x1e) {
          return 1;
        }
        return -(int)lVar2;
      }
      lVar2 = lVar2 + -1;
      pcVar1 = pcVar1 + 1;
    } while (lVar2 != -0x1e);
    return 1;
  }
  return 0;
}

Assistant:

int color_char_to_attr(char c)
{
	int a;

	/* Is negative -- spit it right back out */
	if (c < 0) return (c);

	/* Is a space or '\0' -- return black */
	if (c == '\0' || c == ' ') return (COLOUR_DARK);

	/* Search the color table */
	for (a = 0; a < BASIC_COLORS; a++)
	{
		/* Look for the index */
		if (color_table[a].index_char == c) break;
	}

	/* If we don't find the color, we assume white */
	if (a == BASIC_COLORS) return (COLOUR_WHITE);

	/* Return the color */
	return (a);
}